

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

int envelope_get_y(IT_ENVELOPE *envelope,IT_PLAYING_ENVELOPE *pe)

{
  IT_PLAYING_ENVELOPE *pe_local;
  IT_ENVELOPE *envelope_local;
  
  return pe->value;
}

Assistant:

static int envelope_get_y(IT_ENVELOPE *envelope, IT_PLAYING_ENVELOPE *pe)
{
#if 1
	(void)envelope; //TODO: remove the parameter
	return pe->value;
#else
	int ys, ye;
	int ts, te;
	int t;

	if (pe->next_node <= 0)
		return envelope->node_y[0] << IT_ENVELOPE_SHIFT;

	if (pe->next_node >= envelope->n_nodes)
		return envelope->node_y[envelope->n_nodes-1] << IT_ENVELOPE_SHIFT;

	ys = envelope->node_y[pe->next_node-1] << IT_ENVELOPE_SHIFT;
	ts = envelope->node_t[pe->next_node-1];
	te = envelope->node_t[pe->next_node];

	if (ts == te)
		return ys;

	ye = envelope->node_y[pe->next_node] << IT_ENVELOPE_SHIFT;

	t = pe->tick;

	return ys + (ye - ys) * (t - ts) / (te - ts);
#endif
}